

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

Curl_dns_entry * fetch_addr(Curl_easy *data,char *hostname,int port)

{
  uchar uVar1;
  curl_trc_feat *pcVar2;
  int iVar3;
  size_t sVar4;
  Curl_dns_entry *pCVar5;
  time_t tVar6;
  Curl_addrinfo *pCVar7;
  uint uVar8;
  ulong uVar9;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long lVar10;
  long extraout_RDX_02;
  size_t in_R8;
  Curl_dns_entry *dns;
  char entry_id [262];
  char cStack_128;
  char local_127 [263];
  
  sVar4 = create_hostcache_id(hostname,0,port,&cStack_128,in_R8);
  pCVar5 = (Curl_dns_entry *)Curl_hash_pick((data->dns).hostcache,&cStack_128,sVar4 + 1);
  lVar10 = extraout_RDX;
  if (pCVar5 == (Curl_dns_entry *)0x0) {
    if (((data->state).field_0x776 & 1) == 0) {
      pCVar5 = (Curl_dns_entry *)0x0;
    }
    else {
      Curl_strntolower(&cStack_128,"*",1);
      iVar3 = curl_msnprintf(local_127,7,":%u",(ulong)(uint)port);
      sVar4 = (long)iVar3 + 1;
      pCVar5 = (Curl_dns_entry *)Curl_hash_pick((data->dns).hostcache,&cStack_128,(long)iVar3 + 2);
      lVar10 = extraout_RDX_00;
    }
  }
  if (pCVar5 != (Curl_dns_entry *)0x0) {
    if ((data->set).dns_cache_timeout == -1) goto LAB_001310ce;
    tVar6 = time((time_t *)0x0);
    lVar10 = extraout_RDX_01;
    if ((pCVar5->timestamp == 0) ||
       (lVar10 = (long)(data->set).dns_cache_timeout, tVar6 - pCVar5->timestamp < lVar10))
    goto LAB_001310ce;
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
       ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
      Curl_infof(data,"Hostname in DNS cache was stale, zapped");
    }
    Curl_hash_delete((data->dns).hostcache,&cStack_128,sVar4 + 1);
    lVar10 = extraout_RDX_02;
  }
  pCVar5 = (Curl_dns_entry *)0x0;
LAB_001310ce:
  if (pCVar5 != (Curl_dns_entry *)0x0) {
    uVar1 = data->conn->ip_version;
    if (uVar1 == '\0') {
      return pCVar5;
    }
    uVar9 = 0;
    pCVar7 = pCVar5->addr;
    if (pCVar7 != (Curl_addrinfo *)0x0) {
      uVar8 = (uint)(uVar1 == '\x02') * 8 + 2;
      uVar9 = (ulong)uVar8;
      do {
        if (pCVar7->ai_family == uVar8) {
          return pCVar5;
        }
        pCVar7 = pCVar7->ai_next;
      } while (pCVar7 != (Curl_addrinfo *)0x0);
    }
    if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
       ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
      Curl_infof(data,"Hostname in DNS cache does not have needed family, zapped",
                 CONCAT71((int7)((ulong)lVar10 >> 8),uVar1 == '\x02'),uVar9);
    }
    Curl_hash_delete((data->dns).hostcache,&cStack_128,sVar4 + 1);
  }
  return (Curl_dns_entry *)0x0;
}

Assistant:

static struct Curl_dns_entry *fetch_addr(struct Curl_easy *data,
                                         const char *hostname,
                                         int port)
{
  struct Curl_dns_entry *dns = NULL;
  char entry_id[MAX_HOSTCACHE_LEN];

  /* Create an entry id, based upon the hostname and port */
  size_t entry_len = create_hostcache_id(hostname, 0, port,
                                         entry_id, sizeof(entry_id));

  /* See if it is already in our dns cache */
  dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);

  /* No entry found in cache, check if we might have a wildcard entry */
  if(!dns && data->state.wildcard_resolve) {
    entry_len = create_hostcache_id("*", 1, port, entry_id, sizeof(entry_id));

    /* See if it is already in our dns cache */
    dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);
  }

  if(dns && (data->set.dns_cache_timeout != -1)) {
    /* See whether the returned entry is stale. Done before we release lock */
    struct hostcache_prune_data user;

    user.now = time(NULL);
    user.max_age_sec = data->set.dns_cache_timeout;
    user.oldest = 0;

    if(hostcache_entry_is_stale(&user, dns)) {
      infof(data, "Hostname in DNS cache was stale, zapped");
      dns = NULL; /* the memory deallocation is being handled by the hash */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);
    }
  }

  /* See if the returned entry matches the required resolve mode */
  if(dns && data->conn->ip_version != CURL_IPRESOLVE_WHATEVER) {
    int pf = PF_INET;
    bool found = FALSE;
    struct Curl_addrinfo *addr = dns->addr;

#ifdef PF_INET6
    if(data->conn->ip_version == CURL_IPRESOLVE_V6)
      pf = PF_INET6;
#endif

    while(addr) {
      if(addr->ai_family == pf) {
        found = TRUE;
        break;
      }
      addr = addr->ai_next;
    }

    if(!found) {
      infof(data, "Hostname in DNS cache does not have needed family, zapped");
      dns = NULL; /* the memory deallocation is being handled by the hash */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);
    }
  }
  return dns;
}